

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O1

OledBitmap<128,_64> * __thiscall
SSD1306::OledI2C::getBitmap(OledBitmap<128,_64> *__return_storage_ptr__,OledI2C *this)

{
  int iVar1;
  int y;
  long lVar2;
  long lVar3;
  int x;
  long lVar4;
  
  (__return_storage_ptr__->super_OledPixel)._vptr_OledPixel = (_func_int **)&PTR__OledPixel_0010bd10
  ;
  lVar3 = 0;
  memset(&__return_storage_ptr__->blocks_,0,0x400);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      iVar1 = (*(this->super_OledHardware)._vptr_OledHardware[10])(this,lVar3 + lVar4);
      if ((char)iVar1 != '\0') {
        OledBitmap<128,_64>::setPixel(__return_storage_ptr__,(OledPoint)(lVar3 + lVar4));
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x80);
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x100000000;
  } while (lVar2 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

SSD1306::OledBitmap<SSD1306::OledI2C::Width, SSD1306::OledI2C::Height>
SSD1306::OledI2C::getBitmap() const
{
    OledBitmap<Width, Height> bitmap;

    for (auto y = 0 ; y < Height ; ++y)
    {
        for (auto x = 0 ; x < Width ; ++x)
        {
            OledPoint p{x, y};

            if (isSetPixel(p))
            {
                bitmap.setPixel(p);
            }
        }
    }

    return bitmap;
}